

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void rewind_coloring(saucy *s,coloring *c,int lev)

{
  int iVar1;
  int cf_00;
  int ff_00;
  int splits;
  int ff;
  int cf;
  int i;
  int lev_local;
  coloring *c_local;
  saucy *s_local;
  
  iVar1 = s->splitlev[lev];
  ff = s->nsplits;
  while (ff = ff + -1, iVar1 <= ff) {
    cf_00 = s->splitfrom[ff];
    ff_00 = s->splitwho[ff];
    c->clen[cf_00] = c->clen[ff_00] + 1 + c->clen[cf_00];
    fix_fronts(c,cf_00,ff_00);
  }
  return;
}

Assistant:

static void
rewind_coloring(struct saucy *s, struct coloring *c, int lev)
{
    int i, cf, ff, splits = s->splitlev[lev];
    for (i = s->nsplits - 1; i >= splits; --i) {
        cf = s->splitfrom[i];
        ff = s->splitwho[i];
        c->clen[cf] += c->clen[ff] + 1;
        fix_fronts(c, cf, ff);
    }
}